

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Unique<vk::Handle<(vk::HandleType)9>_> *this;
  PlatformInterface *pPVar1;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  Unique<vk::Handle<(vk::HandleType)23>_> *ptr;
  Parameters *pPVar7;
  Parameters *extraout_RDX;
  ulong uVar8;
  long lVar9;
  size_type __n;
  bool bVar10;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  objects;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_318;
  Environment env;
  Resources res_1;
  Resources res;
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)&res,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar2 = Context::getDeviceInterface(context);
  pVVar3 = Context::getDevice(context);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar7 = (Parameters *)context->m_progCollection;
  env.allocationCallbacks = (VkAllocationCallbacks *)&res.colorAttachment.resources.image.object;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar1;
  env.vkd = pDVar2;
  env.device = pVVar3;
  env.programBinaries = (BinaryCollection *)pPVar7;
  Framebuffer::Resources::Resources(&res_1,&env,(Parameters *)env.allocationCallbacks);
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)&res);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_318,&env,&res_1,pPVar7);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_318.m_data.deleter.m_device;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_318.m_data.object.m_internal;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_318.m_data.deleter.m_deviceIface;
  local_318.m_data.object.m_internal = 0;
  local_318.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_318.m_data.deleter.m_device = (VkDevice)0x0;
  local_318.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_318);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)&res);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&objects);
  Framebuffer::Resources::~Resources(&res_1);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder((AllocationCallbackRecorder *)&res);
  sVar4 = getSafeObjectCount(context,sVar5 - sVar4,0);
  __n = 0x4000;
  if (sVar4 < 0x4000) {
    __n = sVar4;
  }
  Environment::Environment(&env,context,(deUint32)__n);
  Framebuffer::Resources::Resources(&res,&env,extraout_RDX);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::vector(&objects,__n,(allocator_type *)&res_1);
  res_1.colorAttachment.resources.image._0_8_ = context->m_testCtx->m_log;
  this = &res_1.colorAttachment.resources.image.object;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::operator<<((ostream *)this," ");
  pcVar6 = ::vk::getTypeName<vk::Handle<(vk::HandleType)23>>();
  std::operator<<((ostream *)this,pcVar6);
  std::operator<<((ostream *)this," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  lVar9 = 0;
  for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
    ptr = (Unique<vk::Handle<(vk::HandleType)23>_> *)operator_new(0x20);
    Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&res_1,&env,&res,pPVar7);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_device =
         (VkDevice)
         res_1.colorAttachment.resources.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
         m_data.deleter.m_deviceIface;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         res_1.colorAttachment.resources.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
         m_data.deleter.m_device;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
         res_1.colorAttachment.resources.image._0_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         res_1.colorAttachment.resources.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
         m_data.object.m_internal;
    res_1.colorAttachment.resources.image._0_8_ = 0;
    res_1.colorAttachment.resources.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
    m_data.object.m_internal = 0;
    res_1.colorAttachment.resources.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
    m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
    res_1.colorAttachment.resources.image.object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
    m_data.deleter.m_device = (VkDevice)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)&local_318,ptr
              );
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9),
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)&local_318);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_> *)&local_318);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&res_1);
    bVar10 = (uVar8 & 0x3ff) != 0;
    pPVar7 = (Parameters *)CONCAT71((int7)((ulong)pPVar7 >> 8),bVar10 || uVar8 == 0);
    if (!bVar10 && uVar8 != 0) {
      tcu::TestContext::touchWatchdog(context->m_testCtx);
    }
    lVar9 = lVar9 + 0x10;
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res_1,"Ok",(allocator<char> *)&local_318);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&res_1);
  std::__cxx11::string::~string((string *)&res_1);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::~vector(&objects);
  Framebuffer::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}